

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GeneratePBHeader
          (FileGenerator *this,Printer *printer,string *info_path)

{
  char *__rhs;
  string filename_identifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  __rhs = "";
  if ((this->options_).proto_h != false) {
    __rhs = ".pb.h";
  }
  std::operator+(&local_60,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this->file_,
                 __rhs);
  FilenameIdentifier(&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  GenerateTopHeaderGuard(this,printer,&local_40);
  if ((this->options_).proto_h == true) {
    StripProto(&local_60,*(string **)this->file_);
    io::Printer::Print(printer,"#include \"$basename$.proto.h\"  // IWYU pragma: export\n",
                       "basename",&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    GenerateLibraryIncludes(this,printer);
  }
  GenerateDependencyIncludes(this,printer);
  GenerateMetadataPragma(this,printer,info_path);
  if ((this->options_).proto_h == false) {
    GenerateHeader(this,printer);
  }
  else {
    io::Printer::Print(printer,"// @@protoc_insertion_point(includes)\n");
    GenerateNamespaceOpeners(this,printer);
    io::Printer::Print(printer,"\n// @@protoc_insertion_point(namespace_scope)\n");
    GenerateNamespaceClosers(this,printer);
    this = (FileGenerator *)printer;
    io::Printer::Print(printer,"\n// @@protoc_insertion_point(global_scope)\n\n");
  }
  GenerateBottomHeaderGuard(this,printer,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void FileGenerator::GeneratePBHeader(io::Printer* printer,
                                     const string& info_path) {
  string filename_identifier =
      FilenameIdentifier(file_->name() + (options_.proto_h ? ".pb.h" : ""));
  GenerateTopHeaderGuard(printer, filename_identifier);

  if (options_.proto_h) {
    printer->Print("#include \"$basename$.proto.h\"  // IWYU pragma: export\n",
                   "basename", StripProto(file_->name()));
  } else {
    GenerateLibraryIncludes(printer);
  }

  GenerateDependencyIncludes(printer);
  GenerateMetadataPragma(printer, info_path);

  if (!options_.proto_h) {
    GenerateHeader(printer);
  } else {
    // This is unfortunately necessary for some plugins. I don't see why we
    // need two of the same insertion points.
    // TODO(gerbens) remove this.
    printer->Print(
      "// @@protoc_insertion_point(includes)\n");

    // Open namespace.
    GenerateNamespaceOpeners(printer);
    printer->Print(
      "\n"
      "// @@protoc_insertion_point(namespace_scope)\n");
    // Close up namespace.
    GenerateNamespaceClosers(printer);

    printer->Print(
      "\n"
      "// @@protoc_insertion_point(global_scope)\n"
      "\n");
  }

  GenerateBottomHeaderGuard(printer, filename_identifier);
}